

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createFuncptrCall
          (LLVMPointerGraphBuilder *this,CallInst *CInst,Value *calledVal)

{
  PSNode *pPVar1;
  PSNodesSeq *pPVar2;
  PSNode *op;
  PSNode *local_60;
  PSNode *local_58;
  PSNode *local_50;
  initializer_list<dg::pta::PSNode_*> local_48;
  PSNodesSeq local_38;
  
  local_60 = getOperand(this,calledVal);
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)9,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_60);
  local_50 = PointerGraph::create<(dg::pta::PSNodeType)10>((PointerGraph *)this);
  local_50->pairedNode = pPVar1;
  pPVar1->pairedNode = local_50;
  (pPVar1->super_SubgraphNode<dg::pta::PSNode>).user_data = CInst;
  local_48._M_array = &local_58;
  local_48._M_len = 2;
  local_58 = pPVar1;
  PSNodesSeq::PSNodesSeq(&local_38,&local_48);
  pPVar2 = addNode(this,(Value *)CInst,&local_38);
  std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
            ((_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_38);
  return pPVar2;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createFuncptrCall(const llvm::CallInst *CInst,
                                           const llvm::Value *calledVal) {
    // just the call_funcptr and call_return nodes are created and
    // when the pointers are resolved during analysis, the graph
    // will be dynamically created and it will replace these nodes
    PSNode *op = getOperand(calledVal);
    PSNode *call_funcptr = PS.create<PSNodeType::CALL_FUNCPTR>(op);
    PSNode *ret_call = PS.create<PSNodeType::CALL_RETURN>();

    ret_call->setPairedNode(call_funcptr);
    call_funcptr->setPairedNode(ret_call);

    call_funcptr->setUserData(const_cast<llvm::CallInst *>(CInst));

    return addNode(CInst, {call_funcptr, ret_call});
}